

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Vector3f pbrt::SampleUniformSphere(Point2f *u)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  Vector3f VVar5;
  
  auVar1 = vfmadd132ss_fma(ZEXT416((uint)(u->super_Tuple2<pbrt::Point2,_float>).x),
                           SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
  auVar2 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar1,auVar1);
  auVar2 = vmaxss_avx(auVar2,ZEXT816(0) << 0x20);
  auVar2 = vsqrtss_avx(auVar2,auVar2);
  fVar4 = (u->super_Tuple2<pbrt::Point2,_float>).y * 6.2831855;
  fVar3 = cosf(fVar4);
  fVar4 = sinf(fVar4);
  auVar2 = vinsertps_avx(ZEXT416((uint)(fVar3 * auVar2._0_4_)),ZEXT416((uint)(fVar4 * auVar2._0_4_))
                         ,0x10);
  VVar5.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar2._0_8_;
  VVar5.super_Tuple3<pbrt::Vector3,_float>.z = auVar1._0_4_;
  return (Vector3f)VVar5.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

PBRT_CPU_GPU inline Vector3f SampleUniformSphere(const Point2f &u) {
    Float z = 1 - 2 * u[0];
    Float r = SafeSqrt(1 - z * z);
    Float phi = 2 * Pi * u[1];
    return {r * std::cos(phi), r * std::sin(phi), z};
}